

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall CUI::CUI(CUI *this)

{
  this->m_pLastActiveItem = (void *)0x0;
  this->m_pBecommingHotItem = (void *)0x0;
  this->m_pHotItem = (void *)0x0;
  this->m_pActiveItem = (void *)0x0;
  this->m_MouseX = 0.0;
  this->m_MouseY = 0.0;
  this->m_MouseWorldX = 0.0;
  this->m_MouseWorldY = 0.0;
  this->m_MouseButtons = 0;
  this->m_LastMouseButtons = 0;
  this->m_Enabled = true;
  this->m_HotkeysPressed = 0;
  (this->m_Screen).x = 0.0;
  (this->m_Screen).y = 0.0;
  this->m_NumClips = 0;
  this->m_pActiveTooltip = (void *)0x0;
  this->m_aTooltipText[0] = '\0';
  this->m_NumPopupMenus = 0;
  return;
}

Assistant:

CUI::CUI()
{
	m_pHotItem = 0;
	m_pActiveItem = 0;
	m_pLastActiveItem = 0;
	m_pBecommingHotItem = 0;

	m_MouseX = 0;
	m_MouseY = 0;
	m_MouseWorldX = 0;
	m_MouseWorldY = 0;
	m_MouseButtons = 0;
	m_LastMouseButtons = 0;
	m_Enabled = true;

	m_HotkeysPressed = 0;

	m_Screen.x = 0;
	m_Screen.y = 0;

	m_NumClips = 0;

	m_pActiveTooltip = 0;
	m_aTooltipText[0] = '\0';

	m_NumPopupMenus = 0;
}